

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O1

bool __thiscall HttpContext::ParseRequest(HttpContext *this,BufferPtr *buf,uint64_t receive_time)

{
  element_type *peVar1;
  uint uVar2;
  char *colon;
  bool bVar3;
  char *end;
  uint32_t need_len;
  char line_buf [1024];
  bool local_456;
  undefined1 local_455;
  undefined4 local_454;
  BufferPtr *local_450;
  uint64_t local_448;
  undefined8 local_440;
  char local_438 [1032];
  
  local_440 = &this->_request;
  local_456 = true;
  bVar3 = true;
  local_450 = buf;
  local_448 = receive_time;
  do {
    if (this->_state == ExpectHeaders) {
      memset(local_438,0,0x400);
      local_454 = 0;
      peVar1 = (buf->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar2 = (*peVar1->_vptr_Buffer[7])(peVar1,local_438,0x400,"\r\n",2,&local_454);
      if (uVar2 == 0) {
LAB_00107185:
        bVar3 = false;
      }
      else {
        end = local_438 + ((ulong)uVar2 - 2);
        local_455 = 0x3a;
        colon = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_438,end,&local_455);
        if (colon == end) {
          this->_state = GotAll;
          bVar3 = false;
          buf = local_450;
        }
        else {
          HttpRequest::AddHeader(local_440,local_438,colon,end);
          buf = local_450;
        }
      }
    }
    else if (this->_state == ExpectRequestLine) {
      memset(local_438,0,0x400);
      local_454 = 0;
      peVar1 = (buf->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar2 = (*peVar1->_vptr_Buffer[7])(peVar1,local_438,0x400,"\r\n",2,&local_454);
      if ((uVar2 == 0) ||
         (local_456 = processRequestLine(this,local_438,local_438 + uVar2), !local_456))
      goto LAB_00107185;
      (this->_request)._receive_time = local_448;
      this->_state = ExpectHeaders;
    }
    if (!bVar3) {
      return local_456;
    }
  } while( true );
}

Assistant:

bool HttpContext::ParseRequest(cppnet::BufferPtr buf, uint64_t receive_time) {
    bool ok = true;
    bool hasMore = true;
    while (hasMore) {
        if (_state == ExpectRequestLine) {
            char line_buf[1024] = {0};
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            if (size > 0) {
                ok = processRequestLine(line_buf, line_buf + size);
                if (ok) {
                    _request.SetReceiveTime(receive_time);
                    _state = ExpectHeaders;

                } else {
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectHeaders) {
            char line_buf[1024] = { 0 };
            uint32_t need_len = 0;
            uint32_t size = buf->ReadUntil(line_buf, 1024, CRLF, CRLF_LEN, need_len);
            char* end = line_buf + size - CRLF_LEN;
            if (size > 0) {
                const char* colon = std::find(line_buf, end, ':');
                if (colon != end) {
                    _request.AddHeader(line_buf, colon, end);

                } else {
                    // empty line, end of header
                    // FIXME:
                    _state = GotAll;
                    hasMore = false;
                }

            } else {
                hasMore = false;
            }

        } else if (_state == ExpectBody) {
            // TODO:
        }
    }
    return ok;
}